

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isSimpleBitVector(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  Type *ct;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  pTVar2 = getCanonicalType((Type *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  bVar1 = isPredefinedInteger((Type *)0x49d202);
  if ((bVar1) || (bVar1 = isScalar((Type *)0x49d210), bVar1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
    if ((pTVar2->super_Symbol).kind == PackedArrayType) {
      Symbol::as<slang::ast::PackedArrayType>((Symbol *)0x49d237);
      local_1 = isScalar((Type *)0x49d240);
    }
  }
  return local_1;
}

Assistant:

bool Type::isSimpleBitVector() const {
    const Type& ct = getCanonicalType();
    if (ct.isPredefinedInteger() || ct.isScalar())
        return true;

    return ct.kind == SymbolKind::PackedArrayType &&
           ct.as<PackedArrayType>().elementType.isScalar();
}